

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O3

void garray_read(_garray *x,t_symbol *filename)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  _glist *x_00;
  _glist *x_01;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  int elemsize;
  int yonset;
  double f;
  char *bufptr;
  char buf [1000];
  int local_448;
  int local_444;
  FILE *local_440;
  t_symbol *local_438;
  _garray *local_430;
  double local_428;
  char *local_420;
  char local_418 [1000];
  
  x_00 = (_glist *)garray_getarray_floatonly(x,&local_444,&local_448);
  if (x_00 == (_glist *)0x0) {
    pd_error((void *)0x0,"%s: needs floating-point \'y\' field",x->x_realname->s_name);
    return;
  }
  uVar1 = *(uint *)&(x_00->gl_obj).te_g.g_pd;
  x_01 = glist_getcanvas(x_00);
  iVar5 = canvas_open(x_01,filename->s_name,"",local_418,&local_420,1000,0);
  if ((iVar5 < 0) || (local_440 = fdopen(iVar5,"r"), local_440 == (FILE *)0x0)) {
    pd_error((void *)0x0,"%s: can\'t open",filename->s_name);
  }
  else {
    local_430 = x;
    if ((int)uVar1 < 1) {
      uVar7 = 0;
LAB_001342ee:
      auVar4 = _DAT_001b53a0;
      auVar3 = _DAT_001b5390;
      auVar2 = _DAT_001b5380;
      if ((int)uVar7 < (int)uVar1) {
        lVar9 = (long)local_448;
        lVar6 = (long)&((x_00->gl_obj).te_g.g_next)->g_pd + (long)local_444 * 4;
        uVar7 = uVar7 & 0xffffffff;
        lVar10 = uVar1 - uVar7;
        lVar11 = lVar10 + -1;
        auVar12._8_4_ = (int)lVar11;
        auVar12._0_8_ = lVar11;
        auVar12._12_4_ = (int)((ulong)lVar11 >> 0x20);
        uVar8 = 0;
        auVar12 = auVar12 ^ _DAT_001b53a0;
        do {
          auVar13._8_4_ = (int)uVar8;
          auVar13._0_8_ = uVar8;
          auVar13._12_4_ = (int)(uVar8 >> 0x20);
          auVar14 = (auVar13 | auVar3) ^ auVar4;
          iVar5 = auVar12._4_4_;
          if ((bool)(~(auVar14._4_4_ == iVar5 && auVar12._0_4_ < auVar14._0_4_ ||
                      iVar5 < auVar14._4_4_) & 1)) {
            *(undefined4 *)(lVar6 + lVar9 * uVar7) = 0;
          }
          if ((auVar14._12_4_ != auVar12._12_4_ || auVar14._8_4_ <= auVar12._8_4_) &&
              auVar14._12_4_ <= auVar12._12_4_) {
            *(undefined4 *)(lVar6 + (uVar7 + 1) * lVar9) = 0;
          }
          auVar13 = (auVar13 | auVar2) ^ auVar4;
          iVar15 = auVar13._4_4_;
          if (iVar15 <= iVar5 && (iVar15 != iVar5 || auVar13._0_4_ <= auVar12._0_4_)) {
            *(undefined4 *)(lVar6 + (uVar7 + 2) * lVar9) = 0;
            *(undefined4 *)(lVar6 + (uVar7 + 3) * lVar9) = 0;
          }
          uVar8 = uVar8 + 4;
          lVar6 = lVar6 + lVar9 * 4;
        } while ((lVar10 + 3U & 0xfffffffffffffffc) != uVar8);
      }
    }
    else {
      lVar9 = (long)local_448;
      lVar6 = (long)local_444 << 2;
      uVar7 = 0;
      local_438 = filename;
      do {
        iVar5 = __isoc99_fscanf(local_440,"%lf",&local_428);
        if (iVar5 == 0) {
          post("%s: read %d elements into table of size %d",local_438->s_name,uVar7 & 0xffffffff,
               (ulong)uVar1);
          goto LAB_001342ee;
        }
        *(float *)((long)&((x_00->gl_obj).te_g.g_next)->g_pd + lVar6) = (float)local_428;
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + lVar9;
      } while (uVar1 != uVar7);
    }
    fclose(local_440);
    garray_redraw(local_430);
  }
  return;
}

Assistant:

static void garray_read(t_garray *x, t_symbol *filename)
{
    int nelem, filedesc, i;
    FILE *fd;
    char buf[MAXPDSTRING], *bufptr;
    int yonset, elemsize;
    t_array *array = garray_getarray_floatonly(x, &yonset, &elemsize);
    if (!array)
    {
        pd_error(0, "%s: needs floating-point 'y' field", x->x_realname->s_name);
        return;
    }
    nelem = array->a_n;
    if ((filedesc = canvas_open(glist_getcanvas(x->x_glist),
            filename->s_name, "", buf, &bufptr, MAXPDSTRING, 0)) < 0
                || !(fd = fdopen(filedesc, "r")))
    {
        pd_error(0, "%s: can't open", filename->s_name);
        return;
    }
    for (i = 0; i < nelem; i++)
    {
        double f;
        if (!fscanf(fd, "%lf", &f))
        {
            post("%s: read %d elements into table of size %d",
                filename->s_name, i, nelem);
            break;
        }
        else *((t_float *)(array->a_vec + elemsize * i) + yonset) = f;
    }
    while (i < nelem)
        *((t_float *)(array->a_vec +
            elemsize * i) + yonset) = 0, i++;
    fclose(fd);
    garray_redraw(x);
}